

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::logParams(TestLog *log,TestParams *params)

{
  int iVar1;
  Interpolation IVar2;
  MessageBuilder *pMVar3;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0 [3];
  undefined1 local_198 [8];
  MessageBuilder msg;
  TestParams *params_local;
  TestLog *log_local;
  
  msg.m_str._368_8_ = params;
  tcu::TestLog::message((MessageBuilder *)local_198,log);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(char (*) [25])"Pipeline configuration:\n");
  pMVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_198,(char (*) [34])"Vertex and fragment shaders have "
                     );
  local_1b0[0] = "constant";
  if ((*(byte *)(msg.m_str._368_8_ + 3) & 1) != 0) {
    local_1b0[0] = "uniform";
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1b0);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2b8cb14);
  local_1b8 = "different names";
  if ((*(byte *)(msg.m_str._368_8_ + 4) & 1) != 0) {
    local_1b8 = "the same name";
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1b8);
  tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2c7b265);
  if (*(int *)(msg.m_str._368_8_ + 8) == 0) {
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [24])"There are no varyings.\n");
  }
  else {
    if (*(int *)(msg.m_str._368_8_ + 8) == 1) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(char (*) [23])"There is one varying.\n");
    }
    else {
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_198,(char (*) [11])"There are ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)(msg.m_str._368_8_ + 8));
      tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2bfa7a8);
    }
    if (*(int *)(msg.m_str._368_8_ + 0xc) == 0x5e) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(char (*) [31])"Varyings are of random types.\n");
    }
    else {
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_198,(char (*) [23])"Varyings are of type \'");
      local_1c0 = glu::getDataTypeName(*(DataType *)(msg.m_str._368_8_ + 0xc));
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c0);
      tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2c7b264);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [39])"Varying outputs and inputs correspond ");
    iVar1 = *(int *)(msg.m_str._368_8_ + 0x10);
    if (iVar1 == 0) {
      tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,(char (*) [10])"by name.\n");
    }
    else if (iVar1 == 1) {
      tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,(char (*) [14])0x2bfa858);
    }
    else if (iVar1 == 2) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,
                 (char (*) [41])"randomly either by name or by location.\n");
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [49])"In the vertex shader the varyings are qualified ");
    if (*(int *)(msg.m_str._368_8_ + 0x14) == 3) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(char (*) [35])"with no interpolation qualifiers.\n");
    }
    else if (*(int *)(msg.m_str._368_8_ + 0x14) == 4) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,
                 (char (*) [40])"with a random interpolation qualifier.\n");
    }
    else {
      pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,(char (*) [2])0x2b43b10);
      IVar2 = getGluInterpolation(*(VaryingInterpolation *)(msg.m_str._368_8_ + 0x14));
      local_1c8 = glu::getInterpolationName(IVar2);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c8);
      tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2c7b264);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [51])"In the fragment shader the varyings are qualified ");
    if (*(int *)(msg.m_str._368_8_ + 0x18) == 3) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(char (*) [35])"with no interpolation qualifiers.\n");
    }
    else if (*(int *)(msg.m_str._368_8_ + 0x18) == 4) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,
                 (char (*) [40])"with a random interpolation qualifier.\n");
    }
    else {
      pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,(char (*) [2])0x2b43b10);
      IVar2 = getGluInterpolation(*(VaryingInterpolation *)(msg.m_str._368_8_ + 0x18));
      local_1d0 = glu::getInterpolationName(IVar2);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d0);
      tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2c7b264);
    }
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::writeMessage(log,"");
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_198);
  return;
}

Assistant:

void logParams (TestLog& log, const TestParams& params)
{
	// We don't log operational details here since those are shown
	// in the log messages during execution.
	MessageBuilder msg = log.message();

	msg << "Pipeline configuration:\n";

	msg << "Vertex and fragment shaders have "
		<< (params.useUniform ? "uniform" : "constant") << "s with "
		<< (params.useSameName ? "the same name" : "different names") << ".\n";

	if (params.varyings.count == 0)
		msg << "There are no varyings.\n";
	else
	{
		if (params.varyings.count == 1)
			msg << "There is one varying.\n";
		else
			msg << "There are " << params.varyings.count << " varyings.\n";

		if (params.varyings.type == glu::TYPE_LAST)
			msg << "Varyings are of random types.\n";
		else
			msg << "Varyings are of type '"
				<< glu::getDataTypeName(params.varyings.type) << "'.\n";

		msg << "Varying outputs and inputs correspond ";
		switch (params.varyings.binding)
		{
			case BINDING_NAME:
				msg << "by name.\n";
				break;
			case BINDING_LOCATION:
				msg << "by location.\n";
				break;
			case BINDING_LAST:
				msg << "randomly either by name or by location.\n";
				break;
			default:
				DE_FATAL("Impossible");
		}

		msg << "In the vertex shader the varyings are qualified ";
		if (params.varyings.vtxInterp == VARYINGINTERPOLATION_DEFAULT)
			msg << "with no interpolation qualifiers.\n";
		else if (params.varyings.vtxInterp == VARYINGINTERPOLATION_RANDOM)
			msg << "with a random interpolation qualifier.\n";
		else
			msg << "'" << glu::getInterpolationName(getGluInterpolation(params.varyings.vtxInterp)) << "'.\n";

		msg << "In the fragment shader the varyings are qualified ";
		if (params.varyings.frgInterp == VARYINGINTERPOLATION_DEFAULT)
			msg << "with no interpolation qualifiers.\n";
		else if (params.varyings.frgInterp == VARYINGINTERPOLATION_RANDOM)
			msg << "with a random interpolation qualifier.\n";
		else
			msg << "'" << glu::getInterpolationName(getGluInterpolation(params.varyings.frgInterp)) << "'.\n";
	}

	msg << TestLog::EndMessage;

	log.writeMessage("");
}